

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::anon_unknown_0::ReportReflectionUsageError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,char *description)

{
  LogMessage *pLVar1;
  LogFinisher local_61;
  LogMessage local_60;
  
  internal::LogMessage::LogMessage
            (&local_60,LOGLEVEL_FATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x7a);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_60,
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar1 = internal::LogMessage::operator<<(pLVar1,method);
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n  Message type: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)(descriptor + 8));
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n  Field       : ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)(field + 8));
  pLVar1 = internal::LogMessage::operator<<(pLVar1,"\n  Problem     : ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,description);
  internal::LogFinisher::operator=(&local_61,pLVar1);
  internal::LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

void ReportReflectionUsageError(const Descriptor* descriptor,
                                const FieldDescriptor* field,
                                const char* method, const char* description) {
  GOOGLE_LOG(FATAL) << "Protocol Buffer reflection usage error:\n"
                "  Method      : google::protobuf::Reflection::"
             << method
             << "\n"
                "  Message type: "
             << descriptor->full_name()
             << "\n"
                "  Field       : "
             << field->full_name()
             << "\n"
                "  Problem     : "
             << description;
}